

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O3

bool __thiscall
Diligent::PipelineResourceSignatureVkImpl::DvpValidateCommittedResource
          (PipelineResourceSignatureVkImpl *this,DeviceContextVkImpl *pDeviceCtx,
          SPIRVShaderResourceAttribs *SPIRVAttribs,Uint32 ResIndex,
          ShaderResourceCacheVk *ResourceCache,char *ShaderName,char *PSOName)

{
  pointer this_00;
  bool bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Resource *pRVar6;
  PipelineResourceDesc *pPVar7;
  PipelineResourceAttribsType *pPVar8;
  DescriptorSet *this_01;
  Resource *pRVar9;
  TextureViewVkImpl *pViewImpl;
  BufferViewVkImpl *pBVar10;
  BufferVkImpl *pBVar11;
  RenderDeviceVkImpl *pRVar12;
  uint uVar13;
  undefined4 in_register_0000000c;
  char (*Args_1) [47];
  char *Args_1_00;
  ulong uVar14;
  ShaderResourceCacheVk *__return_storage_ptr__;
  ShaderResourceCacheVk *pSVar15;
  Uint64 *Args;
  PipelineResourceAttribsType *pPVar16;
  ulong uVar17;
  RefCntAutoPtr<Diligent::IDeviceObject> *this_02;
  char (*in_stack_ffffffffffffff28) [108];
  string msg;
  bool local_ac;
  ShaderResourceCacheVk local_a0;
  BufferViewDesc *local_68;
  ShaderResourceCacheVk *local_60;
  DeviceContextVkImpl *local_58;
  char *ShaderName_local;
  STDDeleter<void,_Diligent::IMemoryAllocator> local_48;
  _Head_base<0UL,_void_*,_false> local_40;
  DescriptorSet *local_38;
  
  local_a0.m_DbgInitializedResources.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
  local_60 = ResourceCache;
  local_58 = pDeviceCtx;
  ShaderName_local = ShaderName;
  if ((this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      .m_Desc.NumResources <= ResIndex) {
    FormatString<char[26],char[31]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResIndex < m_Desc.NumResources",
               (char (*) [31])CONCAT44(in_register_0000000c,ResIndex));
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
               ,0x329);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pPVar7 = (((PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)
            &(local_a0.m_DbgInitializedResources.
              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->super__Bvector_base<std::allocator<bool>_>
            )->
           super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
           ).m_Desc.Resources;
  pPVar16 = ((PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)
            &(local_a0.m_DbgInitializedResources.
              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->super__Bvector_base<std::allocator<bool>_>
            )->m_pResourceAttribs + ResIndex;
  iVar3 = strcmp(pPVar7[ResIndex].Name,SPIRVAttribs->Name);
  if (iVar3 != 0) {
    FormatString<char[28]>(&msg,(char (*) [28])"Inconsistent resource names");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
               ,0x32c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pSVar15 = local_60;
  local_a0.m_DbgInitializedResources.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pPVar7 + ResIndex);
  if (((PipelineResourceDesc *)
      local_a0.m_DbgInitializedResources.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage)->ResourceType ==
      SHADER_RESOURCE_TYPE_SAMPLER && (long)*(ulong *)pPVar16 < 0) {
    local_ac = true;
  }
  else {
    local_38 = ShaderResourceCacheVk::GetDescriptorSet
                         (local_60,(uint)(*(ulong *)pPVar16 >> 0x3e) & 1);
    uVar17 = (ulong)(~*(uint *)&pSVar15->field_0x1c >> 0x1f);
    local_40._M_head_impl = (void *)(ulong)(&pPVar16->SRBCacheOffset)[uVar17];
    uVar2 = SPIRVAttribs->ArraySize;
    uVar13 = *(uint *)&pPVar16->field_0x4 & 0x1ffffff;
    Args_1 = (char (*) [47])(ulong)uVar13;
    if (uVar13 < uVar2) {
      FormatString<char[26],char[47]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SPIRVAttribs.ArraySize <= ResAttribs.ArraySize",Args_1);
      Args_1 = (char (*) [47])0x335;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                 ,0x335);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      uVar2 = SPIRVAttribs->ArraySize;
    }
    Args_1_00 = (char *)CONCAT71((int7)((ulong)Args_1 >> 8),1);
    local_ac = true;
    if (uVar2 != 0) {
      local_48.m_Allocator = (IMemoryAllocator *)(uVar17 * 4 + 8);
      local_a0.m_DbgInitializedResources.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&SPIRVAttribs->BufferStaticSize;
      uVar13 = 0;
      local_ac = true;
      do {
        pRVar6 = ShaderResourceCacheVk::DescriptorSet::GetResource
                           (local_38,(int)local_40._M_head_impl + uVar13);
        this_00 = local_a0.m_DbgInitializedResources.
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((pRVar6->pObject).m_pObject == (IDeviceObject *)0x0) {
          GetShaderResourcePrintName_abi_cxx11_
                    ((String *)&local_a0,(Diligent *)SPIRVAttribs->Name,
                     (char *)(ulong)SPIRVAttribs->ArraySize,uVar13,(Uint32)ResourceCache);
          Args_1_00 = "\' in shader \'";
          ResourceCache = (ShaderResourceCacheVk *)&ShaderName_local;
          FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                    (&msg,(Diligent *)"No resource is bound to variable \'",(char (*) [35])&local_a0
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      "\' in shader \'",(char (*) [14])ResourceCache,(char **)"\' of PSO \'",
                     (char (*) [11])&PSOName,(char **)0x6a0dd3,
                     (char (*) [2])in_stack_ffffffffffffff28);
          if (local_a0._0_8_ != (long)&local_a0 + 0x10U) {
            operator_delete((void *)local_a0._0_8_,
                            (long)local_a0.m_pMemory._M_t.
                                  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                                  .super__Head_base<0UL,_void_*,_false>._M_head_impl + 1);
          }
          if (DebugMessageCallback != (undefined *)0x0) {
            Args_1_00 = (char *)0x0;
            ResourceCache = (ShaderResourceCacheVk *)0x0;
            (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
          local_ac = false;
        }
        else {
          if ((~(uint)*(ulong *)pPVar16 & 0xffff0000) != 0) {
            pPVar7 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                               ((PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)
                                local_a0.m_DbgInitializedResources.
                                super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (uint)*(ulong *)pPVar16 >> 0x10);
            pPVar8 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                               ((PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)
                                this_00,(uint)*(ushort *)&pPVar16->field_0x2);
            if (pPVar7->ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) {
              FormatString<char[26],char[60]>
                        (&msg,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])
                         "SamplerResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER",
                         (char (*) [60])Args_1_00);
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                         ,0x347);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
            }
            uVar5 = pPVar7->ArraySize;
            uVar4 = 1;
            if ((uVar5 != 1) &&
               (uVar4 = uVar5,
               uVar5 != *(Uint32 *)
                         ((long)local_a0.m_DbgInitializedResources.
                                super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 0xc))) {
              FormatString<char[26],char[79]>
                        (&msg,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])
                         "SamplerResDesc.ArraySize == 1 || SamplerResDesc.ArraySize == ResDesc.ArraySize"
                         ,(char (*) [79])(ulong)uVar5);
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                         ,0x348);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
              uVar4 = pPVar7->ArraySize;
            }
            if ((-1 < *(long *)pPVar8) && (uVar13 < uVar4)) {
              this_01 = ShaderResourceCacheVk::GetDescriptorSet
                                  (local_60,(uint)((ulong)*(long *)pPVar8 >> 0x3e));
              pRVar9 = ShaderResourceCacheVk::DescriptorSet::GetResource
                                 (this_01,*(int *)((long)&(local_48.m_Allocator)->
                                                          _vptr_IMemoryAllocator +
                                                  (long)&pPVar8->field_0x0) + uVar13);
              if ((pRVar9->pObject).m_pObject == (IDeviceObject *)0x0) {
                GetShaderResourcePrintName_abi_cxx11_
                          ((String *)&local_a0,(Diligent *)pPVar7->Name,
                           (char *)(ulong)pPVar7->ArraySize,uVar13,(Uint32)ResourceCache);
                ResourceCache = (ShaderResourceCacheVk *)SPIRVAttribs;
                FormatString<char[42],std::__cxx11::string,char[26],char_const*,char[14],char_const*,char[11],char_const*,char[3]>
                          (&msg,(Diligent *)"No sampler is bound to sampler variable \'",
                           (char (*) [42])&local_a0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "\' combined with texture \'",(char (*) [26])SPIRVAttribs,
                           (char **)"\' in shader \'",(char (*) [14])&ShaderName_local,
                           (char **)"\' of PSO \'",(char (*) [11])&PSOName,(char **)"\'.",
                           (char (*) [3])in_stack_ffffffffffffff28);
                if (local_a0._0_8_ != (long)&local_a0 + 0x10U) {
                  operator_delete((void *)local_a0._0_8_,
                                  (long)local_a0.m_pMemory._M_t.
                                        super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                                        .super__Head_base<0UL,_void_*,_false>._M_head_impl + 1);
                }
                if (DebugMessageCallback != (undefined *)0x0) {
                  ResourceCache = (ShaderResourceCacheVk *)0x0;
                  (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != &msg.field_2) {
                  operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                }
                local_ac = false;
              }
            }
          }
          Args_1_00 = (char *)(*(ulong *)pPVar16 >> 0x39 & 0xffffff1f);
          if ((byte)Args_1_00 < 0xd) {
            this_02 = &pRVar6->pObject;
            uVar5 = (uint)(*(ulong *)pPVar16 >> 0x39) & 0x1f;
            Args_1_00 = (char *)0x1e00;
            if ((0x1e00U >> uVar5 & 1) == 0) {
              Args_1_00 = (char *)0xe;
              if ((0xeU >> uVar5 & 1) == 0) {
                Args_1_00 = (char *)0x180;
                if ((0x180U >> uVar5 & 1) != 0) {
                  if (*(SHADER_RESOURCE_TYPE *)
                       ((long)local_a0.m_DbgInitializedResources.
                              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x10) !=
                      SHADER_RESOURCE_TYPE_CONSTANT_BUFFER) {
                    FormatString<char[26],char[61]>
                              (&msg,(Diligent *)"Debug expression failed:\n",
                               (char (*) [26])
                               "ResDesc.ResourceType == SHADER_RESOURCE_TYPE_CONSTANT_BUFFER",
                               (char (*) [61])0x180);
                    Args_1_00 = (char *)0x35e;
                    DebugAssertionFailed
                              (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                               ,0x35e);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg._M_dataplus._M_p != &msg.field_2) {
                      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                    }
                  }
                  pBVar11 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::BufferVkImpl>
                                      (this_02);
                  if (((pBVar11 != (BufferVkImpl *)0x0) &&
                      (DeviceContextVkImpl::DvpVerifyDynamicAllocation(local_58,pBVar11),
                      (pBVar11->super_BufferBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                      .m_Desc.Size <
                      (ulong)*(uint *)local_a0.m_DbgInitializedResources.
                                      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)) &&
                     (pRVar12 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                             *)local_a0.m_DbgInitializedResources.
                                               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start),
                     ((pRVar12->
                      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_ValidationFlags &
                     VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE) != VALIDATION_FLAG_NONE)) {
                    __return_storage_ptr__ = &local_a0;
                    GetShaderResourcePrintName_abi_cxx11_
                              ((String *)__return_storage_ptr__,(Diligent *)SPIRVAttribs->Name,
                               (char *)(ulong)SPIRVAttribs->ArraySize,uVar13,(Uint32)ResourceCache);
                    Args_1_00 = "\' bound to shader variable \'";
                    FormatString<char[29],char_const*,char[29],std::__cxx11::string,char[6],unsigned_long,char[41],unsigned_int,char[8]>
                              (&msg,(Diligent *)"The size of uniform buffer \'",
                               (char (*) [29])
                               &(pBVar11->super_BufferBase<Diligent::EngineVkImplTraits>).
                                super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                .m_Desc,(char **)"\' bound to shader variable \'",
                               (char (*) [29])__return_storage_ptr__,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "\' is ",(char (*) [6])
                                        &(pBVar11->super_BufferBase<Diligent::EngineVkImplTraits>).
                                         super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                         .m_Desc.Size,
                               (unsigned_long *)" bytes, but the shader expects at least ",
                               (char (*) [41])
                               local_a0.m_DbgInitializedResources.
                               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,(uint *)0x7534b5,
                               (char (*) [8])in_stack_ffffffffffffff28);
                    if (local_a0._0_8_ != (long)&local_a0 + 0x10U) {
                      operator_delete((void *)local_a0._0_8_,
                                      (long)local_a0.m_pMemory._M_t.
                                            super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                                            .super__Head_base<0UL,_void_*,_false>._M_head_impl + 1);
                    }
                    if (DebugMessageCallback != (undefined *)0x0) {
                      Args_1_00 = (char *)0x0;
                      __return_storage_ptr__ = (ShaderResourceCacheVk *)0x0;
                      (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0);
                    }
                    goto LAB_00223b3d;
                  }
                }
              }
              else {
                if ((*(SHADER_RESOURCE_TYPE *)
                      ((long)local_a0.m_DbgInitializedResources.
                             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x10) !=
                     SHADER_RESOURCE_TYPE_TEXTURE_SRV) &&
                   (*(SHADER_RESOURCE_TYPE *)
                     ((long)local_a0.m_DbgInitializedResources.
                            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x10) !=
                    SHADER_RESOURCE_TYPE_TEXTURE_UAV)) {
                  FormatString<char[26],char[117]>
                            (&msg,(Diligent *)"Debug expression failed:\n",
                             (char (*) [26])
                             "ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV"
                             ,(char (*) [117])0xe);
                  Args_1_00 = (char *)0x39e;
                  DebugAssertionFailed
                            (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                             ,0x39e);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg._M_dataplus._M_p != &msg.field_2) {
                    operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                  }
                }
                pViewImpl = RefCntAutoPtr<Diligent::IDeviceObject>::
                            RawPtr<Diligent::TextureViewVkImpl>(this_02);
                if (pViewImpl != (TextureViewVkImpl *)0x0) {
                  uVar5 = (byte)SPIRVAttribs->field_0xb & 0x7f;
                  ResourceCache = (ShaderResourceCacheVk *)(ulong)uVar5;
                  bVar1 = ValidateResourceViewDimension<Diligent::TextureViewVkImpl>
                                    (SPIRVAttribs->Name,(uint)SPIRVAttribs->ArraySize,uVar13,
                                     pViewImpl,(RESOURCE_DIMENSION)uVar5,
                                     (bool)((byte)SPIRVAttribs->field_0xb >> 7));
                  local_ac = (bool)(bVar1 & local_ac);
                  Args_1_00 = (char *)pViewImpl;
                }
              }
            }
            else {
              if ((*(SHADER_RESOURCE_TYPE *)
                    ((long)local_a0.m_DbgInitializedResources.
                           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x10) !=
                   SHADER_RESOURCE_TYPE_BUFFER_SRV) &&
                 (*(SHADER_RESOURCE_TYPE *)
                   ((long)local_a0.m_DbgInitializedResources.
                          super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x10) !=
                  SHADER_RESOURCE_TYPE_BUFFER_UAV)) {
                FormatString<char[26],char[115]>
                          (&msg,(Diligent *)"Debug expression failed:\n",
                           (char (*) [26])
                           "ResDesc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV"
                           ,(char (*) [115])0x1e00);
                Args_1_00 = (char *)0x376;
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                           ,0x376);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != &msg.field_2) {
                  operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                }
              }
              pBVar10 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::BufferViewVkImpl>
                                  (this_02);
              if (pBVar10 != (BufferViewVkImpl *)0x0) {
                pBVar11 = (BufferVkImpl *)
                          (pBVar10->super_BufferViewBase<Diligent::EngineVkImplTraits>).m_pBuffer;
                if (pBVar11 != (BufferVkImpl *)0x0) {
                  CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)pBVar11);
                }
                local_68 = &(pBVar10->super_BufferViewBase<Diligent::EngineVkImplTraits>).
                            super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                            .m_Desc;
                pSVar15 = (ShaderResourceCacheVk *)
                          &(pBVar11->super_BufferBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                           .m_Desc;
                DeviceContextVkImpl::DvpVerifyDynamicAllocation(local_58,pBVar11);
                Args_1_00 = (char *)(ulong)(pBVar11->super_BufferBase<Diligent::EngineVkImplTraits>)
                                           .
                                           super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                           .m_Desc.ElementByteStride;
                Args = &(pBVar10->super_BufferViewBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                        .m_Desc.ByteWidth;
                uVar17 = (pBVar10->super_BufferViewBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                         .m_Desc.ByteWidth;
                uVar14 = (ulong)*(uint *)local_a0.m_DbgInitializedResources.
                                         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish;
                if ((TextureViewVkImpl *)Args_1_00 == (TextureViewVkImpl *)0x0) {
                  if ((uVar17 < uVar14) &&
                     (pRVar12 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                             *)local_a0.m_DbgInitializedResources.
                                               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start),
                     ((pRVar12->
                      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_ValidationFlags &
                     VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE) != VALIDATION_FLAG_NONE)) {
                    GetShaderResourcePrintName_abi_cxx11_
                              ((String *)&local_a0,(Diligent *)SPIRVAttribs->Name,
                               (char *)(ulong)SPIRVAttribs->ArraySize,uVar13,(Uint32)ResourceCache);
                    Args_1_00 = "\' of buffer \'";
                    FormatString<char[26],char_const*,char[14],char_const*,char[29],std::__cxx11::string,char[6],unsigned_long,char[41],unsigned_int,char[8]>
                              (&msg,(Diligent *)"The size of buffer view \'",(char (*) [26])local_68
                               ,(char **)"\' of buffer \'",(char (*) [14])pSVar15,
                               (char **)"\' bound to shader variable \'",(char (*) [29])&local_a0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "\' is ",(char (*) [6])Args,
                               (unsigned_long *)" bytes, but the shader expects at least ",
                               (char (*) [41])
                               local_a0.m_DbgInitializedResources.
                               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,(uint *)0x7534b5,
                               (char (*) [8])in_stack_ffffffffffffff28);
                    __return_storage_ptr__ = pSVar15;
                    if (local_a0._0_8_ != (long)&local_a0 + 0x10U) {
                      operator_delete((void *)local_a0._0_8_,
                                      (long)local_a0.m_pMemory._M_t.
                                            super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                                            .super__Head_base<0UL,_void_*,_false>._M_head_impl + 1);
                      __return_storage_ptr__ = pSVar15;
                    }
                    if (DebugMessageCallback != (undefined *)0x0) {
                      Args_1_00 = (char *)0x0;
                      __return_storage_ptr__ = (ShaderResourceCacheVk *)0x0;
                      (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0);
                    }
                    goto LAB_00223b3d;
                  }
                }
                else if (((uVar17 < uVar14) || ((uVar17 - uVar14) % (ulong)Args_1_00 != 0)) &&
                        (pRVar12 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                   ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                                *)local_a0.m_DbgInitializedResources.
                                                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                        ((pRVar12->
                         super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                         ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_ValidationFlags &
                        VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE) != VALIDATION_FLAG_NONE)) {
                  __return_storage_ptr__ =
                       (ShaderResourceCacheVk *)
                       &(pBVar11->super_BufferBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        .m_Desc.ElementByteStride;
                  GetShaderResourcePrintName_abi_cxx11_
                            ((String *)&local_a0,(Diligent *)SPIRVAttribs->Name,
                             (char *)(ulong)SPIRVAttribs->ArraySize,uVar13,(Uint32)ResourceCache);
                  Args_1_00 = ") and stride (";
                  FormatString<char[11],unsigned_long,char[15],unsigned_int,char[19],char_const*,char[14],char_const*,char[29],std::__cxx11::string,char[108]>
                            (&msg,(Diligent *)"The size (",(char (*) [11])Args,
                             (unsigned_long *)") and stride (",(char (*) [15])__return_storage_ptr__
                             ,(uint *)") of buffer view \'",(char (*) [19])local_68,
                             (char **)"\' of buffer \'",(char (*) [14])pSVar15,
                             (char **)"\' bound to shader variable \'",(char (*) [29])&local_a0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "\' are incompatible with what the shader expects. This may be the result of the array element size mismatch."
                             ,in_stack_ffffffffffffff28);
                  if (local_a0._0_8_ != (long)&local_a0 + 0x10U) {
                    operator_delete((void *)local_a0._0_8_,
                                    (long)local_a0.m_pMemory._M_t.
                                          super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                                          .super__Head_base<0UL,_void_*,_false>._M_head_impl + 1);
                  }
                  if (DebugMessageCallback != (undefined *)0x0) {
                    Args_1_00 = (char *)0x0;
                    __return_storage_ptr__ = (ShaderResourceCacheVk *)0x0;
                    (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0);
                  }
LAB_00223b3d:
                  ResourceCache = __return_storage_ptr__;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg._M_dataplus._M_p != &msg.field_2) {
                    operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                    ResourceCache = __return_storage_ptr__;
                  }
                }
              }
            }
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < SPIRVAttribs->ArraySize);
    }
  }
  return local_ac;
}

Assistant:

bool PipelineResourceSignatureVkImpl::DvpValidateCommittedResource(const DeviceContextVkImpl*        pDeviceCtx,
                                                                   const SPIRVShaderResourceAttribs& SPIRVAttribs,
                                                                   Uint32                            ResIndex,
                                                                   const ShaderResourceCacheVk&      ResourceCache,
                                                                   const char*                       ShaderName,
                                                                   const char*                       PSOName) const
{
    VERIFY_EXPR(ResIndex < m_Desc.NumResources);
    const auto& ResDesc    = m_Desc.Resources[ResIndex];
    const auto& ResAttribs = m_pResourceAttribs[ResIndex];
    VERIFY(strcmp(ResDesc.Name, SPIRVAttribs.Name) == 0, "Inconsistent resource names");

    if (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER && ResAttribs.IsImmutableSamplerAssigned())
        return true; // Skip immutable separate samplers

    const auto& DescrSetResources = ResourceCache.GetDescriptorSet(ResAttribs.DescrSet);
    const auto  CacheType         = ResourceCache.GetContentType();
    const auto  CacheOffset       = ResAttribs.CacheOffset(CacheType);

    VERIFY_EXPR(SPIRVAttribs.ArraySize <= ResAttribs.ArraySize);

    bool BindingsOK = true;
    for (Uint32 ArrIndex = 0; ArrIndex < SPIRVAttribs.ArraySize; ++ArrIndex)
    {
        const auto& Res = DescrSetResources.GetResource(CacheOffset + ArrIndex);
        if (Res.IsNull())
        {
            LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(SPIRVAttribs, ArrIndex),
                              "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
            BindingsOK = false;
            continue;
        }

        if (ResAttribs.IsCombinedWithSampler())
        {
            const auto& SamplerResDesc = GetResourceDesc(ResAttribs.SamplerInd);
            const auto& SamplerAttribs = GetResourceAttribs(ResAttribs.SamplerInd);
            VERIFY_EXPR(SamplerResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER);
            VERIFY_EXPR(SamplerResDesc.ArraySize == 1 || SamplerResDesc.ArraySize == ResDesc.ArraySize);
            if (!SamplerAttribs.IsImmutableSamplerAssigned())
            {
                if (ArrIndex < SamplerResDesc.ArraySize)
                {
                    const auto& SamDescrSetResources = ResourceCache.GetDescriptorSet(SamplerAttribs.DescrSet);
                    const auto  SamCacheOffset       = SamplerAttribs.CacheOffset(CacheType);
                    const auto& Sam                  = SamDescrSetResources.GetResource(SamCacheOffset + ArrIndex);
                    if (Sam.IsNull())
                    {
                        LOG_ERROR_MESSAGE("No sampler is bound to sampler variable '", GetShaderResourcePrintName(SamplerResDesc, ArrIndex),
                                          "' combined with texture '", SPIRVAttribs.Name, "' in shader '", ShaderName, "' of PSO '", PSOName, "'.");
                        BindingsOK = false;
                    }
                }
            }
        }

        switch (ResAttribs.GetDescriptorType())
        {
            case DescriptorType::UniformBuffer:
            case DescriptorType::UniformBufferDynamic:
                VERIFY_EXPR(ResDesc.ResourceType == SHADER_RESOURCE_TYPE_CONSTANT_BUFFER);
                // When can use raw cast here because the dynamic type is verified when the resource
                // is bound. It will be null if the type is incorrect.
                if (const auto* pBufferVk = Res.pObject.RawPtr<BufferVkImpl>())
                {
                    pDeviceCtx->DvpVerifyDynamicAllocation(pBufferVk);

                    if ((pBufferVk->GetDesc().Size < SPIRVAttribs.BufferStaticSize) &&
                        (GetDevice()->GetValidationFlags() & VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE) != 0)
                    {
                        // It is OK if robustBufferAccess feature is enabled, otherwise access outside of buffer range may lead to crash or undefined behavior.
                        LOG_WARNING_MESSAGE("The size of uniform buffer '",
                                            pBufferVk->GetDesc().Name, "' bound to shader variable '",
                                            GetShaderResourcePrintName(SPIRVAttribs, ArrIndex), "' is ", pBufferVk->GetDesc().Size,
                                            " bytes, but the shader expects at least ", SPIRVAttribs.BufferStaticSize,
                                            " bytes.");
                    }
                }
                break;

            case DescriptorType::StorageBuffer:
            case DescriptorType::StorageBuffer_ReadOnly:
            case DescriptorType::StorageBufferDynamic:
            case DescriptorType::StorageBufferDynamic_ReadOnly:
                VERIFY_EXPR(ResDesc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV);
                // When can use raw cast here because the dynamic type is verified when the resource
                // is bound. It will be null if the type is incorrect.
                if (auto* pBufferViewVk = Res.pObject.RawPtr<BufferViewVkImpl>())
                {
                    const auto* pBufferVk = ClassPtrCast<BufferVkImpl>(pBufferViewVk->GetBuffer());
                    const auto& ViewDesc  = pBufferViewVk->GetDesc();
                    const auto& BuffDesc  = pBufferVk->GetDesc();

                    pDeviceCtx->DvpVerifyDynamicAllocation(pBufferVk);

                    if (BuffDesc.ElementByteStride == 0)
                    {
                        if ((ViewDesc.ByteWidth < SPIRVAttribs.BufferStaticSize) &&
                            (GetDevice()->GetValidationFlags() & VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE) != 0)
                        {
                            // It is OK if robustBufferAccess feature is enabled, otherwise access outside of buffer range may lead to crash or undefined behavior.
                            LOG_WARNING_MESSAGE("The size of buffer view '", ViewDesc.Name, "' of buffer '", BuffDesc.Name, "' bound to shader variable '",
                                                GetShaderResourcePrintName(SPIRVAttribs, ArrIndex), "' is ", ViewDesc.ByteWidth, " bytes, but the shader expects at least ",
                                                SPIRVAttribs.BufferStaticSize, " bytes.");
                        }
                    }
                    else
                    {
                        if ((ViewDesc.ByteWidth < SPIRVAttribs.BufferStaticSize || (ViewDesc.ByteWidth - SPIRVAttribs.BufferStaticSize) % BuffDesc.ElementByteStride != 0) &&
                            (GetDevice()->GetValidationFlags() & VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE) != 0)
                        {
                            // For buffers with dynamic arrays we know only static part size and array element stride.
                            // Element stride in the shader may be differ than in the code. Here we check that the buffer size is exactly the same as the array with N elements.
                            LOG_WARNING_MESSAGE("The size (", ViewDesc.ByteWidth, ") and stride (", BuffDesc.ElementByteStride, ") of buffer view '",
                                                ViewDesc.Name, "' of buffer '", BuffDesc.Name, "' bound to shader variable '",
                                                GetShaderResourcePrintName(SPIRVAttribs, ArrIndex), "' are incompatible with what the shader expects. This may be the result of the array element size mismatch.");
                        }
                    }
                }
                break;

            case DescriptorType::StorageImage:
            case DescriptorType::SeparateImage:
            case DescriptorType::CombinedImageSampler:
                VERIFY_EXPR(ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV);
                // When can use raw cast here because the dynamic type is verified when the resource
                // is bound. It will be null if the type is incorrect.
                if (const auto* pTexViewVk = Res.pObject.RawPtr<TextureViewVkImpl>())
                {
                    if (!ValidateResourceViewDimension(SPIRVAttribs.Name, SPIRVAttribs.ArraySize, ArrIndex, pTexViewVk, SPIRVAttribs.GetResourceDimension(), SPIRVAttribs.IsMultisample()))
                        BindingsOK = false;
                }
                break;

            default:
                break;
                // Nothing to do
        }
    }

    return BindingsOK;
}